

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O0

UChar32 getMirror(UChar32 c,uint16_t props)

{
  uint uVar1;
  UChar32 c2;
  int32_t length;
  int32_t i;
  uint32_t m;
  uint32_t *mirrors;
  int32_t delta;
  UChar32 UStack_c;
  uint16_t props_local;
  UChar32 c_local;
  
  if ((int)(short)props >> 0xd == -4) {
    for (c2 = 0; UStack_c = c, c2 < 0x28; c2 = c2 + 1) {
      uVar1 = ubidi_props_mirrors[c2] & 0x1fffff;
      if (c == uVar1) {
        return ubidi_props_mirrors[ubidi_props_mirrors[c2] >> 0x15] & 0x1fffff;
      }
      if (c < (int)uVar1) {
        return c;
      }
    }
  }
  else {
    UStack_c = c + ((int)(short)props >> 0xd);
  }
  return UStack_c;
}

Assistant:

static UChar32
getMirror(UChar32 c, uint16_t props) {
    int32_t delta=UBIDI_GET_MIRROR_DELTA(props);
    if(delta!=UBIDI_ESC_MIRROR_DELTA) {
        return c+delta;
    } else {
        /* look for mirror code point in the mirrors[] table */
        const uint32_t *mirrors;
        uint32_t m;
        int32_t i, length;
        UChar32 c2;

        mirrors=ubidi_props_singleton.mirrors;
        length=ubidi_props_singleton.indexes[UBIDI_IX_MIRROR_LENGTH];

        /* linear search */
        for(i=0; i<length; ++i) {
            m=mirrors[i];
            c2=UBIDI_GET_MIRROR_CODE_POINT(m);
            if(c==c2) {
                /* found c, return its mirror code point using the index in m */
                return UBIDI_GET_MIRROR_CODE_POINT(mirrors[UBIDI_GET_MIRROR_INDEX(m)]);
            } else if(c<c2) {
                break;
            }
        }

        /* c not found, return it itself */
        return c;
    }
}